

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

void response_written(cio_http_client *client,cio_error err)

{
  cio_http_location_handler *pcVar1;
  cio_http_server *pcVar2;
  size_t in_RDX;
  undefined4 in_register_00000034;
  cio_http_server *server;
  cio_websocket *websocket;
  cio_websocket_location_handler *wslh;
  cio_error err_local;
  cio_http_client *client_local;
  
  pcVar1 = client->current_handler;
  if (err == CIO_SUCCESS) {
    pcVar1[4].on_host = (cio_http_data_cb_t)client;
    (*pcVar1[0xc].on_body)
              ((cio_http_client *)&pcVar1[3].on_body,(char *)CONCAT44(in_register_00000034,err),
               in_RDX);
  }
  else {
    pcVar2 = cio_http_client_get_server(client);
    if (pcVar2->on_error != (cio_http_serve_on_error_t)0x0) {
      (*pcVar2->on_error)(pcVar2,"error while writing http upgrade response");
    }
  }
  return;
}

Assistant:

static void response_written(struct cio_http_client *client, enum cio_error err)
{
	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);
	struct cio_websocket *websocket = &wslh->websocket;

	if (cio_unlikely(err != CIO_SUCCESS)) {
		struct cio_http_server *server = cio_http_client_get_server(client);
		if (server->on_error != NULL) {
			server->on_error(server, "error while writing http upgrade response");
		}

		return;
	}

	websocket->ws_private.http_client = client;
	websocket->on_connect(websocket);
}